

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

DTLSWriteEpoch * bssl::dtls_get_write_epoch(SSL *ssl,uint16_t epoch)

{
  uint16_t uVar1;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *puVar2;
  pointer pDVar3;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *e;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *__end1;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *__begin1;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *__range1;
  uint16_t epoch_local;
  SSL *ssl_local;
  
  uVar1 = DTLSWriteEpoch::epoch(&ssl->d1->write_epoch);
  if (uVar1 == epoch) {
    ssl_local = (SSL *)&ssl->d1->write_epoch;
  }
  else {
    this = &ssl->d1->extra_write_epochs;
    __end1 = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::
             begin(this);
    puVar2 = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::end
                       (this);
    for (; __end1 != puVar2; __end1 = __end1 + 1) {
      pDVar3 = std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>::operator->(__end1);
      uVar1 = DTLSWriteEpoch::epoch(pDVar3);
      if (uVar1 == epoch) {
        pDVar3 = std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>::get(__end1);
        return pDVar3;
      }
    }
    ssl_local = (SSL *)0x0;
  }
  return (DTLSWriteEpoch *)ssl_local;
}

Assistant:

DTLSWriteEpoch *dtls_get_write_epoch(const SSL *ssl, uint16_t epoch) {
  if (ssl->d1->write_epoch.epoch() == epoch) {
    return &ssl->d1->write_epoch;
  }
  for (const auto &e : ssl->d1->extra_write_epochs) {
    if (e->epoch() == epoch) {
      return e.get();
    }
  }
  return nullptr;
}